

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::setUniformsBeforeDrawCall
          (GeometryShaderRenderingTrianglesCase *this,_draw_call_type drawcall_type)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 extraout_var;
  bool bVar13;
  undefined8 extraout_RDX;
  long lVar12;
  
  iVar1 = (*((this->super_GeometryShaderRenderingCase).m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar12 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_lines_output");
  uVar3 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_indexed_draw_call");
  uVar4 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_instanced_draw_call");
  uVar5 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_points_output");
  uVar6 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangle_fan_input");
  uVar7 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangle_strip_input");
  uVar8 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_triangle_strip_adjacency_input");
  uVar9 = (**(code **)(lVar12 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_triangles_adjacency_input");
  uVar10 = (**(code **)(lVar12 + 0xb48))
                     ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangles_input");
  uVar11 = (**(code **)(lVar12 + 0xb48))
                     ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangles_output");
  (**(code **)(lVar12 + 0x14f0))
            (uVar2,*(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 1);
  (**(code **)(lVar12 + 0x14f0))
            (uVar5,*(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 0);
  (**(code **)(lVar12 + 0x14f0))(uVar6,this->m_drawcall_mode == 6);
  (**(code **)(lVar12 + 0x14f0))(uVar7,this->m_drawcall_mode == 5);
  (**(code **)(lVar12 + 0x14f0))(uVar9,this->m_drawcall_mode == 0xc);
  (**(code **)(lVar12 + 0x14f0))(uVar8,this->m_drawcall_mode == 0xd);
  (**(code **)(lVar12 + 0x14f0))(uVar10,this->m_drawcall_mode == 4);
  (**(code **)(lVar12 + 0x14f0))
            (uVar11,*(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 2);
  bVar13 = drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS ||
           (drawcall_type & ~DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED) ==
           DRAW_CALL_TYPE_GL_DRAW_ELEMENTS;
  (**(code **)(lVar12 + 0x14f0))(uVar3,bVar13,extraout_RDX,bVar13);
  (**(code **)(lVar12 + 0x14f0))
            (uVar4,(drawcall_type & ~DRAW_CALL_TYPE_GL_DRAW_ELEMENTS) ==
                   DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED);
  return;
}

Assistant:

void GeometryShaderRenderingTrianglesCase::setUniformsBeforeDrawCall(_draw_call_type drawcall_type)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint is_lines_output_uniform_location			= gl.getUniformLocation(m_po_id, "is_lines_output");
	glw::GLint is_indexed_draw_call_uniform_location	= gl.getUniformLocation(m_po_id, "is_indexed_draw_call");
	glw::GLint is_instanced_draw_call_uniform_location  = gl.getUniformLocation(m_po_id, "is_instanced_draw_call");
	glw::GLint is_points_output_uniform_location		= gl.getUniformLocation(m_po_id, "is_points_output");
	glw::GLint is_triangle_fan_input_uniform_location   = gl.getUniformLocation(m_po_id, "is_triangle_fan_input");
	glw::GLint is_triangle_strip_input_uniform_location = gl.getUniformLocation(m_po_id, "is_triangle_strip_input");
	glw::GLint is_triangle_strip_adjacency_input_uniform_location =
		gl.getUniformLocation(m_po_id, "is_triangle_strip_adjacency_input");
	glw::GLint is_triangles_adjacency_input_uniform_location =
		gl.getUniformLocation(m_po_id, "is_triangles_adjacency_input");
	glw::GLint is_triangles_input_uniform_location  = gl.getUniformLocation(m_po_id, "is_triangles_input");
	glw::GLint is_triangles_output_uniform_location = gl.getUniformLocation(m_po_id, "is_triangles_output");

	gl.uniform1i(is_lines_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_LINE_STRIP);
	gl.uniform1i(is_points_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_POINTS);
	gl.uniform1i(is_triangle_fan_input_uniform_location, m_drawcall_mode == GL_TRIANGLE_FAN);
	gl.uniform1i(is_triangle_strip_input_uniform_location, m_drawcall_mode == GL_TRIANGLE_STRIP);
	gl.uniform1i(is_triangles_adjacency_input_uniform_location, m_drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT);
	gl.uniform1i(is_triangle_strip_adjacency_input_uniform_location,
				 m_drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT);
	gl.uniform1i(is_triangles_input_uniform_location, m_drawcall_mode == GL_TRIANGLES);
	gl.uniform1i(is_triangles_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP);
	gl.uniform1i(is_indexed_draw_call_uniform_location, (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS));
	gl.uniform1i(is_instanced_draw_call_uniform_location,
				 (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED) ||
					 (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED));
}